

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O3

bool cmPolicies::ApplyPolicyVersion(cmMakefile *mf,char *version)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ostream *poVar7;
  size_t sVar8;
  char *pcVar9;
  cmState *this;
  PolicyID id;
  PolicyStatus status;
  bool bVar10;
  uint minorVer;
  uint majorVer;
  uint patchVer;
  string defaultVar;
  uint tweakVer;
  string ver;
  vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> ancientPolicies;
  string defaultValue;
  ostringstream e;
  undefined1 auStack_288 [8];
  uint local_280;
  uint local_27c;
  uint local_278;
  allocator local_271;
  string local_270;
  uint local_24c;
  long *local_248;
  char *local_240;
  long local_238 [2];
  vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> local_228;
  long *local_208;
  long local_200;
  long local_1f8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_248 = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"2.4.0","");
  pcVar9 = local_240;
  if ((version != (char *)0x0) && (*version != '\0')) {
    strlen(version);
    std::__cxx11::string::_M_replace((ulong)&local_248,0,pcVar9,(ulong)version);
  }
  local_27c = 2;
  local_280 = 0;
  local_278 = 0;
  local_24c = 0;
  iVar2 = __isoc99_sscanf(local_248,"%u.%u.%u.%u");
  uVar5 = local_27c;
  if (iVar2 < 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Invalid policy version value \"",0x1e);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_248,(long)local_240);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".  ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"A numeric major.minor[.patch[.tweak]] must be given.",0x34);
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_270);
LAB_003744be:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    if ((1 < local_27c) && ((local_27c != 2 || (3 < local_280)))) {
      uVar3 = cmVersion::GetMajorVersion();
      uVar4 = local_27c;
      if (((uVar5 <= uVar3) &&
          (((uVar3 = cmVersion::GetMajorVersion(), uVar5 = local_280, uVar4 != uVar3 ||
            (uVar4 = cmVersion::GetMinorVersion(), uVar5 <= uVar4)) &&
           ((uVar4 = local_27c, uVar3 = cmVersion::GetMajorVersion(), uVar5 = local_280,
            uVar4 != uVar3 ||
            ((uVar3 = cmVersion::GetMinorVersion(), uVar4 = local_278, uVar5 != uVar3 ||
             (uVar5 = cmVersion::GetPatchVersion(), uVar4 <= uVar5)))))))) &&
         ((uVar4 = local_27c, uVar3 = cmVersion::GetMajorVersion(), uVar5 = local_280,
          uVar4 != uVar3 ||
          (((uVar3 = cmVersion::GetMinorVersion(), uVar4 = local_278, uVar5 != uVar3 ||
            (uVar3 = cmVersion::GetPatchVersion(), uVar5 = local_24c, uVar4 != uVar3)) ||
           (uVar4 = cmVersion::GetTweakVersion(), uVar5 <= uVar4)))))) {
        local_228.super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_228.super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_228.super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        id = CMP0000;
        do {
          switch(id) {
          case CMP0000:
          case CMP0001:
          case CMP0002:
          case CMP0003:
          case CMP0004:
          case CMP0005:
          case CMP0006:
          case CMP0007:
            if ((1 < local_27c) && (local_27c != 2 || 6 < local_280 + 1)) {
              if ((local_27c == 2) && (local_280 == 6)) {
LAB_003749a5:
                if (local_278 == 0xffffffff) break;
              }
              goto switchD_003746a9_default;
            }
            break;
          case CMP0008:
            if ((1 < local_27c) && (local_27c != 2 || 6 < local_280 + 1)) {
              uVar5 = local_280 ^ 6;
LAB_00374d8d:
              bVar1 = uVar5 == 0 && local_27c == 2;
              bVar10 = local_278 + 1 < 2;
LAB_00374dc9:
              if (!(bool)(bVar1 & bVar10)) goto switchD_003746a9_default;
            }
            break;
          case CMP0009:
            if ((1 < local_27c) && (local_27c != 2 || 6 < local_280 + 1)) {
              bVar1 = local_280 == 6 && local_27c == 2;
              bVar10 = local_278 + 1 < 3;
              goto LAB_00374dc9;
            }
            break;
          case CMP0010:
          case CMP0011:
            if ((1 < local_27c) && (local_27c != 2 || 6 < local_280 + 1)) {
              uVar5 = local_280 ^ 6;
LAB_0037496c:
              bVar1 = uVar5 == 0 && local_27c == 2;
              bVar10 = local_278 + 1 < 4;
              goto LAB_00374dc9;
            }
            break;
          case CMP0012:
          case CMP0013:
          case CMP0014:
            if ((1 < local_27c) && (local_27c != 2 || 8 < local_280 + 1)) {
              if (local_27c == 2) {
LAB_0037499c:
                if (local_280 == 8) goto LAB_003749a5;
              }
              goto switchD_003746a9_default;
            }
            break;
          case CMP0015:
            if ((1 < local_27c) && (local_27c != 2 || 8 < local_280 + 1)) {
              uVar5 = local_280 ^ 8;
              goto LAB_00374d8d;
            }
            break;
          case CMP0016:
            if ((1 < local_27c) && (local_27c != 2 || 8 < local_280 + 1)) {
              uVar5 = local_280 ^ 8;
              goto LAB_0037496c;
            }
            break;
          case CMP0017:
            if ((1 < local_27c) && (local_27c != 2 || 8 < local_280 + 1)) {
              bVar1 = local_280 == 8 && local_27c == 2;
              bVar10 = local_278 + 1 < 5;
              goto LAB_00374dc9;
            }
            break;
          case CMP0018:
            if ((1 < local_27c) && (local_27c != 2 || 8 < local_280 + 1)) {
              bVar1 = local_280 == 8 && local_27c == 2;
              bVar10 = local_278 + 1 < 10;
              goto LAB_00374dc9;
            }
            break;
          case CMP0019:
          case CMP0020:
            if ((1 < local_27c) && (local_27c != 2 || 8 < local_280 + 1)) {
              bVar1 = local_280 == 8 && local_27c == 2;
              bVar10 = local_278 + 1 < 0xc;
              goto LAB_00374dc9;
            }
            break;
          case CMP0021:
          case CMP0022:
          case CMP0023:
            if ((1 < local_27c) && (local_27c != 2 || 8 < local_280 + 1)) {
              bVar1 = local_280 == 8 && local_27c == 2;
              bVar10 = local_278 + 1 < 0xd;
              goto LAB_00374dc9;
            }
            break;
          case CMP0024:
          case CMP0025:
          case CMP0026:
          case CMP0027:
          case CMP0028:
          case CMP0029:
          case CMP0030:
          case CMP0031:
          case CMP0032:
          case CMP0033:
          case CMP0034:
          case CMP0035:
          case CMP0036:
          case CMP0037:
          case CMP0038:
          case CMP0039:
          case CMP0040:
          case CMP0041:
          case CMP0042:
          case CMP0043:
          case CMP0044:
          case CMP0045:
          case CMP0046:
          case CMP0047:
          case CMP0048:
          case CMP0049:
          case CMP0050:
            if ((2 < local_27c) && (local_280 != 0xffffffff || local_27c != 3)) {
              if ((local_27c == 3) && (local_280 == 0)) goto LAB_003749a5;
              goto switchD_003746a9_default;
            }
            break;
          case CMP0051:
          case CMP0052:
          case CMP0053:
          case CMP0054:
            if ((2 < local_27c) && (local_27c != 3 || 1 < local_280 + 1)) {
              if ((local_27c == 3) && (local_280 == 1)) goto LAB_003749a5;
              goto switchD_003746a9_default;
            }
            break;
          case CMP0055:
          case CMP0056:
            if ((2 < local_27c) && (local_27c != 3 || 2 < local_280 + 1)) {
              if ((local_27c == 3) && (local_280 == 2)) goto LAB_003749a5;
              goto switchD_003746a9_default;
            }
            break;
          case CMP0057:
          case CMP0058:
          case CMP0059:
          case CMP0060:
          case CMP0061:
          case CMP0062:
          case CMP0063:
            if ((2 < local_27c) && (local_27c != 3 || 3 < local_280 + 1)) {
              if ((local_27c == 3) && (local_280 == 3)) goto LAB_003749a5;
              goto switchD_003746a9_default;
            }
            break;
          case CMP0064:
          case CMP0065:
            if ((2 < local_27c) && (local_27c != 3 || 4 < local_280 + 1)) {
              if ((local_27c == 3) && (local_280 == 4)) goto LAB_003749a5;
              goto switchD_003746a9_default;
            }
            break;
          case CMP0066:
            if ((2 < local_27c) && (local_27c != 3 || 7 < local_280 + 1)) {
              if ((local_27c == 3) && (local_280 == 7)) goto LAB_003749a5;
              goto switchD_003746a9_default;
            }
            break;
          case CMP0067:
            if ((2 < local_27c) && (local_27c != 3 || 8 < local_280 + 1)) {
              if (local_27c == 3) goto LAB_0037499c;
              goto switchD_003746a9_default;
            }
            break;
          case CMP0068:
          case CMP0069:
            if ((2 < local_27c) && (local_27c != 3 || 9 < local_280 + 1)) {
              if ((local_27c == 3) && (local_280 == 9)) goto LAB_003749a5;
              goto switchD_003746a9_default;
            }
            break;
          case CMP0070:
          case CMP0071:
            if ((2 < local_27c) && (local_27c != 3 || 10 < local_280 + 1)) {
              if ((local_27c == 3) && (local_280 == 10)) goto LAB_003749a5;
              goto switchD_003746a9_default;
            }
            break;
          default:
switchD_003746a9_default:
            bVar1 = cmMakefile::SetPolicy(mf,id,NEW);
            if (bVar1) goto LAB_00374deb;
            goto LAB_00374f02;
          }
          pcVar9 = idToString(id);
          std::__cxx11::string::string((string *)&local_1e8,pcVar9,&local_271);
          std::operator+(&local_270,"CMAKE_POLICY_DEFAULT_",&local_1e8);
          pcVar9 = cmMakefile::GetSafeDefinition(mf,&local_270);
          std::__cxx11::string::string((string *)&local_208,pcVar9,(allocator *)local_1a8);
          iVar2 = std::__cxx11::string::compare((char *)&local_208);
          bVar1 = true;
          if (iVar2 == 0) {
            status = NEW;
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)&local_208);
            if (iVar6 == 0) {
              status = OLD;
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)&local_208);
              status = WARN;
              if (iVar6 != 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,local_270._M_dataplus._M_p,
                                    local_270._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," has value \"",0xc);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(char *)local_208,local_200);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"\" but must be \"OLD\", \"NEW\", or \"\" (empty).",0x2a);
                std::__cxx11::stringbuf::str();
                cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_1c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                  operator_delete(local_1c8._M_dataplus._M_p,
                                  local_1c8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base(local_138);
                bVar1 = false;
              }
            }
          }
          if (local_208 != local_1f8) {
            operator_delete(local_208,local_1f8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
          }
          if (!bVar1) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            goto LAB_00374f02;
          }
          bVar1 = cmMakefile::SetPolicy(mf,id,status);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          if (!bVar1) goto LAB_00374f02;
          if (id == CMP0001 && iVar2 != 0) {
            this = cmMakefile::GetState(mf);
            local_1a8._0_8_ = local_1a8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"CMAKE_BACKWARDS_COMPATIBILITY","");
            pcVar9 = cmState::GetInitializedCacheValue(this,(string *)local_1a8);
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
            }
            if (pcVar9 == (char *)0x0) {
              local_1a8._0_8_ = local_1a8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1a8,"CMAKE_BACKWARDS_COMPATIBILITY","");
              cmMakefile::AddCacheDefinition
                        (mf,(string *)local_1a8,"2.4",
                         "For backwards compatibility, what version of CMake commands and syntax should this version of CMake try to support."
                         ,STRING,false);
              if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
              }
            }
          }
LAB_00374deb:
          id = id + CMP0001;
        } while (id != CMPCOUNT);
        if (local_228.
            super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_228.
            super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          bVar1 = true;
        }
        else {
          DiagnoseAncientPolicies(&local_228,local_27c,local_280,local_278,mf);
          cmSystemTools::s_FatalErrorOccured = true;
LAB_00374f02:
          bVar1 = false;
        }
        if (local_228.
            super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_228.
                          super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_228.
                                super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_228.
                                super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        goto LAB_00374571;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"An attempt was made to set the policy version of CMake to \""
                 ,0x3b);
      if (version == (char *)0x0) {
        std::ios::clear((int)(auStack_288 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) + 0xe0);
      }
      else {
        sVar8 = strlen(version);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,version,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\" which is greater than this version of CMake.  ",0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "This is not allowed because the greater version may have new ",0x3d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"policies not known to this CMake.  ",0x23);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"You may need a newer CMake version to build this project.",
                 0x39);
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_270);
      goto LAB_003744be;
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.  For compatibility with older versions please use any CMake 2.8.x release or lower."
               ,"");
    cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
  }
  bVar1 = false;
LAB_00374571:
  if (local_248 != local_238) {
    operator_delete(local_248,local_238[0] + 1);
  }
  return bVar1;
}

Assistant:

bool cmPolicies::ApplyPolicyVersion(cmMakefile* mf, const char* version)
{
  std::string ver = "2.4.0";

  if (version && strlen(version) > 0) {
    ver = version;
  }

  unsigned int majorVer = 2;
  unsigned int minorVer = 0;
  unsigned int patchVer = 0;
  unsigned int tweakVer = 0;

  // parse the string
  if (sscanf(ver.c_str(), "%u.%u.%u.%u", &majorVer, &minorVer, &patchVer,
             &tweakVer) < 2) {
    std::ostringstream e;
    e << "Invalid policy version value \"" << ver << "\".  "
      << "A numeric major.minor[.patch[.tweak]] must be given.";
    mf->IssueMessage(cmake::FATAL_ERROR, e.str());
    return false;
  }

  // it is an error if the policy version is less than 2.4
  if (majorVer < 2 || (majorVer == 2 && minorVer < 4)) {
    mf->IssueMessage(
      cmake::FATAL_ERROR,
      "Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.  "
      "For compatibility with older versions please use any CMake 2.8.x "
      "release or lower.");
    return false;
  }

  // It is an error if the policy version is greater than the running
  // CMake.
  if (majorVer > cmVersion::GetMajorVersion() ||
      (majorVer == cmVersion::GetMajorVersion() &&
       minorVer > cmVersion::GetMinorVersion()) ||
      (majorVer == cmVersion::GetMajorVersion() &&
       minorVer == cmVersion::GetMinorVersion() &&
       patchVer > cmVersion::GetPatchVersion()) ||
      (majorVer == cmVersion::GetMajorVersion() &&
       minorVer == cmVersion::GetMinorVersion() &&
       patchVer == cmVersion::GetPatchVersion() &&
       tweakVer > cmVersion::GetTweakVersion())) {
    std::ostringstream e;
    e << "An attempt was made to set the policy version of CMake to \""
      << version << "\" which is greater than this version of CMake.  "
      << "This is not allowed because the greater version may have new "
      << "policies not known to this CMake.  "
      << "You may need a newer CMake version to build this project.";
    mf->IssueMessage(cmake::FATAL_ERROR, e.str());
    return false;
  }

  // now loop over all the policies and set them as appropriate
  std::vector<cmPolicies::PolicyID> ancientPolicies;
  for (PolicyID pid = cmPolicies::CMP0000; pid != cmPolicies::CMPCOUNT;
       pid = PolicyID(pid + 1)) {
    if (isPolicyNewerThan(pid, majorVer, minorVer, patchVer)) {
      if (cmPolicies::GetPolicyStatus(pid) == cmPolicies::REQUIRED_ALWAYS) {
        ancientPolicies.push_back(pid);
      } else {
        cmPolicies::PolicyStatus status = cmPolicies::WARN;
        if (!GetPolicyDefault(mf, idToString(pid), &status) ||
            !mf->SetPolicy(pid, status)) {
          return false;
        }
        if (pid == cmPolicies::CMP0001 &&
            (status == cmPolicies::WARN || status == cmPolicies::OLD)) {
          if (!(mf->GetState()->GetInitializedCacheValue(
                "CMAKE_BACKWARDS_COMPATIBILITY"))) {
            // Set it to 2.4 because that is the last version where the
            // variable had meaning.
            mf->AddCacheDefinition(
              "CMAKE_BACKWARDS_COMPATIBILITY", "2.4",
              "For backwards compatibility, what version of CMake "
              "commands and "
              "syntax should this version of CMake try to support.",
              cmStateEnums::STRING);
          }
        }
      }
    } else {
      if (!mf->SetPolicy(pid, cmPolicies::NEW)) {
        return false;
      }
    }
  }

  // Make sure the project does not use any ancient policies.
  if (!ancientPolicies.empty()) {
    DiagnoseAncientPolicies(ancientPolicies, majorVer, minorVer, patchVer, mf);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  return true;
}